

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O1

void __thiscall
perfetto::ipc::HostImpl::ExposedService::ExposedService
          (ExposedService *this,ExposedService *param_2)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pcVar3;
  undefined8 uVar4;
  
  this->id = param_2->id;
  paVar1 = &(this->name).field_2;
  (this->name)._M_dataplus._M_p = (pointer)paVar1;
  pcVar3 = (param_2->name)._M_dataplus._M_p;
  paVar2 = &(param_2->name).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 == paVar2) {
    uVar4 = *(undefined8 *)((long)&(param_2->name).field_2 + 8);
    paVar1->_M_allocated_capacity = paVar2->_M_allocated_capacity;
    *(undefined8 *)((long)&(this->name).field_2 + 8) = uVar4;
  }
  else {
    (this->name)._M_dataplus._M_p = pcVar3;
    (this->name).field_2._M_allocated_capacity = paVar2->_M_allocated_capacity;
  }
  (this->name)._M_string_length = (param_2->name)._M_string_length;
  (param_2->name)._M_dataplus._M_p = (pointer)paVar2;
  (param_2->name)._M_string_length = 0;
  (param_2->name).field_2._M_local_buf[0] = '\0';
  (this->instance)._M_t.
  super___uniq_ptr_impl<perfetto::ipc::Service,_std::default_delete<perfetto::ipc::Service>_>._M_t.
  super__Tuple_impl<0UL,_perfetto::ipc::Service_*,_std::default_delete<perfetto::ipc::Service>_>.
  super__Head_base<0UL,_perfetto::ipc::Service_*,_false>._M_head_impl =
       (param_2->instance)._M_t.
       super___uniq_ptr_impl<perfetto::ipc::Service,_std::default_delete<perfetto::ipc::Service>_>.
       _M_t.
       super__Tuple_impl<0UL,_perfetto::ipc::Service_*,_std::default_delete<perfetto::ipc::Service>_>
       .super__Head_base<0UL,_perfetto::ipc::Service_*,_false>._M_head_impl;
  (param_2->instance)._M_t.
  super___uniq_ptr_impl<perfetto::ipc::Service,_std::default_delete<perfetto::ipc::Service>_>._M_t.
  super__Tuple_impl<0UL,_perfetto::ipc::Service_*,_std::default_delete<perfetto::ipc::Service>_>.
  super__Head_base<0UL,_perfetto::ipc::Service_*,_false>._M_head_impl = (Service *)0x0;
  return;
}

Assistant:

HostImpl::ExposedService::ExposedService(ExposedService&&) noexcept = default;